

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_source_push_name(ScpSource *scp,ptrlen pathname,fxp_attrs attrs,char *wc)

{
  uint uVar1;
  size_t s;
  void *pvVar2;
  ptrlen handle;
  char *wc_local;
  ScpSource *scp_local;
  ptrlen pathname_local;
  
  s = pathname.len;
  pvVar2 = pathname.ptr;
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) == (undefined1  [56])0x0) {
    uVar1 = string_length_for_printf(s);
    scp_source_err(scp,"unable to read file permissions for %.*s",(ulong)uVar1,pvVar2);
  }
  else {
    if (((undefined1  [56])attrs & (undefined1  [56])0x4000) == (undefined1  [56])0x0) {
      if (((undefined1  [56])attrs & (undefined1  [56])0x1) == (undefined1  [56])0x0) {
        uVar1 = string_length_for_printf(s);
        scp_source_err(scp,"unable to read file size for %.*s",(ulong)uVar1,pvVar2);
        return;
      }
    }
    else if (((scp->recursive & 1U) == 0) && (wc == (char *)0x0)) {
      uVar1 = string_length_for_printf(s);
      scp_source_err(scp,"%.*s: is a directory",(ulong)uVar1,pvVar2);
      return;
    }
    handle = make_ptrlen("",0);
    scp_source_push(scp,SCP_NAME,pathname,handle,&attrs,wc);
  }
  return;
}

Assistant:

static void scp_source_push_name(
    ScpSource *scp, ptrlen pathname, struct fxp_attrs attrs, const char *wc)
{
    if (!(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
        scp_source_err(scp, "unable to read file permissions for %.*s",
                       PTRLEN_PRINTF(pathname));
        return;
    }
    if (attrs.permissions & PERMS_DIRECTORY) {
        if (!scp->recursive && !wc) {
            scp_source_err(scp, "%.*s: is a directory",
                           PTRLEN_PRINTF(pathname));
            return;
        }
    } else {
        if (!(attrs.flags & SSH_FILEXFER_ATTR_SIZE)) {
            scp_source_err(scp, "unable to read file size for %.*s",
                           PTRLEN_PRINTF(pathname));
            return;
        }
    }

    scp_source_push(scp, SCP_NAME, pathname, PTRLEN_LITERAL(""), &attrs, wc);
}